

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

Result __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load>::canOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this,Literal *literal)

{
  address64_t aVar1;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar2;
  Result RVar3;
  Address local_40;
  ulong local_38;
  uint64_t total;
  uint64_t value;
  Literal *literal_local;
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Load> *this_local;
  Address local_10;
  
  value = (uint64_t)literal;
  literal_local = (Literal *)this;
  total = wasm::Literal::getInteger(literal);
  if (total < 0x400) {
    aVar1 = wasm::Address::operator_cast_to_unsigned_long(&this->curr->offset);
    local_38 = aVar1 + total;
    if (local_38 < 0x400) {
      wasm::Address::Address(&local_40,local_38);
      Result::Result((Result *)&this_local,local_40);
      uVar2 = extraout_RAX;
      goto LAB_018a36e0;
    }
  }
  Result::Result((Result *)&this_local);
  uVar2 = extraout_RAX_00;
LAB_018a36e0:
  RVar3._1_7_ = (undefined7)((ulong)uVar2 >> 8);
  RVar3.succeeded = (bool)this_local._0_1_;
  RVar3.total.addr = local_10.addr;
  return RVar3;
}

Assistant:

Result canOptimizeConstant(Literal literal) {
    uint64_t value = literal.getInteger();
    // Avoid uninteresting corner cases with peculiar offsets.
    if (value < PassOptions::LowMemoryBound) {
      // The total offset must not allow reaching reasonable memory
      // by overflowing.
      auto total = curr->offset + value;
      if (total < PassOptions::LowMemoryBound) {
        return Result(total);
      }
    }
    return Result();
  }